

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,double arg0)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Interval local_90;
  Interval local_78;
  Interval local_60;
  Interval local_48;
  double local_30;
  double prec;
  double exact;
  double arg0_local;
  EvalContext *ctx_local;
  FloatFunc1 *this_local;
  
  exact = arg0;
  arg0_local = (double)ctx;
  ctx_local = (EvalContext *)this;
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xd])(arg0);
  prec = extraout_XMM0_Qa;
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xf])(extraout_XMM0_Qa,exact,this,arg0_local);
  local_30 = extraout_XMM0_Qa_00;
  tcu::Interval::Interval(&local_48,prec);
  tcu::Interval::Interval(&local_78,-local_30);
  tcu::Interval::Interval(&local_90,local_30);
  tcu::Interval::Interval(&local_60,&local_78,&local_90);
  tcu::operator+(__return_storage_ptr__,&local_48,&local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext& ctx, double arg0) const
	{
		const double	exact	= this->applyExact(arg0);
		const double	prec	= this->precision(ctx, exact, arg0);

		return exact + Interval(-prec, prec);
	}